

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall OPL::DOSBox::DBOPL::Chip::WriteBD(Chip *this,Bit8u val)

{
  Operator *pOVar1;
  byte bVar2;
  code *pcVar3;
  
  if (this->regBD == val) {
    return;
  }
  bVar2 = this->regBD ^ val;
  this->regBD = val;
  this->vibratoStrength = (val & 0x40) == 0;
  this->tremoloStrength = (byte)~val >> 6 & 2;
  if ((val & 0x20) == 0) {
    if ((bVar2 & 0x20) == 0) {
      return;
    }
    Channel::ResetC0(this->chan + 6,this);
    Operator::KeyOff(this->chan[6].op,'\x02');
    Operator::KeyOff(this->chan[6].op + 1,'\x02');
    Operator::KeyOff(this->chan[7].op,'\x02');
    Operator::KeyOff(this->chan[7].op + 1,'\x02');
    Operator::KeyOff(this->chan[8].op,'\x02');
  }
  else {
    if ((bVar2 & 0x20) != 0) {
      if (this->opl3Active == '\0') {
        pcVar3 = Channel::BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)10>;
      }
      else {
        pcVar3 = Channel::BlockTemplate<(OPL::DOSBox::DBOPL::SynthMode)11>;
      }
      this->chan[6].synthHandler = (SynthHandler)pcVar3;
      *(undefined8 *)&this->chan[6].field_0xd8 = 0;
    }
    pOVar1 = this->chan[6].op + 1;
    if ((val & 0x10) == 0) {
      Operator::KeyOff(this->chan[6].op,'\x02');
      Operator::KeyOff(pOVar1,'\x02');
    }
    else {
      Operator::KeyOn(this->chan[6].op,'\x02');
      Operator::KeyOn(pOVar1,'\x02');
    }
    if ((val & 1) == 0) {
      Operator::KeyOff(this->chan[7].op,'\x02');
    }
    else {
      Operator::KeyOn(this->chan[7].op,'\x02');
    }
    pOVar1 = this->chan[7].op + 1;
    if ((val & 8) == 0) {
      Operator::KeyOff(pOVar1,'\x02');
    }
    else {
      Operator::KeyOn(pOVar1,'\x02');
    }
    if ((val & 4) == 0) {
      Operator::KeyOff(this->chan[8].op,'\x02');
    }
    else {
      Operator::KeyOn(this->chan[8].op,'\x02');
    }
    if ((val & 2) != 0) {
      Operator::KeyOn(this->chan[8].op + 1,'\x02');
      return;
    }
  }
  Operator::KeyOff(this->chan[8].op + 1,'\x02');
  return;
}

Assistant:

void Chip::WriteBD( Bit8u val ) {
	Bit8u change = regBD ^ val;
	if ( !change )
		return;
	regBD = val;
	//TODO could do this with shift and xor?
	vibratoStrength = (val & 0x40) ? 0x00 : 0x01;
	tremoloStrength = (val & 0x80) ? 0x00 : 0x02;
	if ( val & 0x20 ) {
		//Drum was just enabled, make sure channel 6 has the right synth
		if ( change & 0x20 ) {
			if ( opl3Active ) {
				chan[6].synthHandler = &Channel::BlockTemplate< sm3Percussion >;
			} else {
				chan[6].synthHandler = &Channel::BlockTemplate< sm2Percussion >;
			}
		}
		//Bass Drum
		if ( val & 0x10 ) {
			chan[6].op[0].KeyOn( 0x2 );
			chan[6].op[1].KeyOn( 0x2 );
		} else {
			chan[6].op[0].KeyOff( 0x2 );
			chan[6].op[1].KeyOff( 0x2 );
		}
		//Hi-Hat
		if ( val & 0x1 ) {
			chan[7].op[0].KeyOn( 0x2 );
		} else {
			chan[7].op[0].KeyOff( 0x2 );
		}
		//Snare
		if ( val & 0x8 ) {
			chan[7].op[1].KeyOn( 0x2 );
		} else {
			chan[7].op[1].KeyOff( 0x2 );
		}
		//Tom-Tom
		if ( val & 0x4 ) {
			chan[8].op[0].KeyOn( 0x2 );
		} else {
			chan[8].op[0].KeyOff( 0x2 );
		}
		//Top Cymbal
		if ( val & 0x2 ) {
			chan[8].op[1].KeyOn( 0x2 );
		} else {
			chan[8].op[1].KeyOff( 0x2 );
		}
	//Toggle keyoffs when we turn off the percussion
	} else if ( change & 0x20 ) {
		//Trigger a reset to setup the original synth handler
		chan[6].ResetC0( this );
		chan[6].op[0].KeyOff( 0x2 );
		chan[6].op[1].KeyOff( 0x2 );
		chan[7].op[0].KeyOff( 0x2 );
		chan[7].op[1].KeyOff( 0x2 );
		chan[8].op[0].KeyOff( 0x2 );
		chan[8].op[1].KeyOff( 0x2 );
	}
}